

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O1

bool __thiscall
absl::numbers_internal::safe_strto8_base
          (numbers_internal *this,string_view text,int8_t *value,int base)

{
  numbers_internal *pnVar1;
  numbers_internal nVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  char cVar6;
  numbers_internal *in_RAX;
  char cVar7;
  uint uVar8;
  bool bVar9;
  char *pcVar10;
  numbers_internal *pnVar11;
  numbers_internal *pnVar12;
  numbers_internal *pnVar13;
  uint uVar14;
  
  uVar8 = (uint)value;
  pcVar10 = text._M_str;
  pnVar12 = (numbers_internal *)text._M_len;
  *pcVar10 = '\0';
  if (pnVar12 == (numbers_internal *)0x0) {
LAB_001a43c3:
    bVar9 = false;
  }
  else {
    pnVar11 = pnVar12;
    if (0 < (long)this) {
      do {
        if (((&ascii_internal::kPropertyBits)[(byte)*pnVar11] & 8) == 0) break;
        pnVar11 = pnVar11 + 1;
      } while (pnVar11 < pnVar12 + (long)this);
    }
    pnVar13 = pnVar12 + 1;
    in_RAX = pnVar12;
    do {
      if (in_RAX + (long)this <= pnVar11) goto LAB_001a43c3;
      pnVar1 = in_RAX + -1;
      pnVar13 = pnVar13 + -1;
      in_RAX = in_RAX + -1;
    } while (((&ascii_internal::kPropertyBits)[(byte)pnVar1[(long)this]] & 8) != 0);
    nVar2 = *pnVar11;
    pnVar1 = in_RAX + (long)this;
    in_RAX = (numbers_internal *)(ulong)(nVar2 == (numbers_internal)0x2d);
    if (((nVar2 == (numbers_internal)0x2d) || (nVar2 == (numbers_internal)0x2b)) &&
       (pnVar11 = pnVar11 + 1, pnVar1 + 1 <= pnVar11)) {
LAB_001a4558:
      bVar9 = false;
    }
    else {
      if (uVar8 == 0x10) {
        uVar14 = 0x10;
        if (((1 < (long)(pnVar13 + ((long)this - (long)pnVar11))) &&
            (*pnVar11 == (numbers_internal)0x30)) && (((byte)pnVar11[1] | 0x20) == 0x78)) {
LAB_001a4542:
          pnVar11 = pnVar11 + 2;
          uVar14 = 0x10;
          if (pnVar1 + 1 <= pnVar11) goto LAB_001a4558;
        }
      }
      else if (uVar8 == 0) {
        if (((1 < (long)(pnVar13 + ((long)this - (long)pnVar11))) &&
            (*pnVar11 == (numbers_internal)0x30)) && (((byte)pnVar11[1] | 0x20) == 0x78))
        goto LAB_001a4542;
        if ((long)(pnVar13 + ((long)this - (long)pnVar11)) < 1) {
          uVar14 = 10;
        }
        else {
          nVar2 = *pnVar11;
          pnVar11 = pnVar11 + (nVar2 == (numbers_internal)0x30);
          uVar14 = (uint)(nVar2 != (numbers_internal)0x30) * 2 + 8;
        }
      }
      else {
        uVar14 = uVar8;
        if (0x22 < uVar8 - 2) goto LAB_001a4558;
      }
      uVar8 = uVar14;
      this = pnVar13 + ((long)this - (long)pnVar11);
      bVar9 = true;
      pnVar12 = pnVar11;
    }
  }
  if (!bVar9) {
    return false;
  }
  cVar7 = (char)uVar8;
  if (((ulong)in_RAX & 1) == 0) {
    if ((int)uVar8 < 0) {
      __assert_fail("base >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/numbers.cc"
                    ,0x3dc,
                    "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, IntType * _Nonnull) [IntType = signed char]"
                   );
    }
    cVar3 = (anonymous_namespace)::LookupTables<signed_char>::kVmaxOverBase[uVar8];
    if ((1 < (int)uVar8) && ((int)(0x7f / (long)(int)cVar7) != (int)cVar3)) {
      __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/numbers.cc"
                    ,0x3e1,
                    "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, IntType * _Nonnull) [IntType = signed char]"
                   );
    }
    if (0 < (long)this) {
      pnVar11 = this + (long)pnVar12;
      bVar9 = false;
      cVar6 = '\0';
      do {
        cVar4 = (anonymous_namespace)::kAsciiToInt[(byte)*pnVar12];
        if ((int)cVar4 < (int)cVar7) {
          if ((cVar3 < cVar6) || (cVar6 = cVar6 * cVar7, 0x7f - cVar4 < (int)cVar6)) {
            *pcVar10 = '\x7f';
            goto LAB_001a44ec;
          }
          cVar6 = cVar4 + cVar6;
          bVar5 = true;
        }
        else {
          *pcVar10 = cVar6;
LAB_001a44ec:
          bVar5 = false;
        }
        if (!bVar5) {
          return bVar9;
        }
        pnVar12 = pnVar12 + 1;
        bVar9 = pnVar12 >= pnVar11;
      } while (pnVar12 < pnVar11);
      goto LAB_001a450b;
    }
  }
  else {
    if (0x80 < (int)uVar8) {
      __assert_fail("vmin <= 0 - base",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/numbers.cc"
                    ,0x401,
                    "bool absl::(anonymous namespace)::safe_parse_negative_int(absl::string_view, int, IntType * _Nonnull) [IntType = signed char]"
                   );
    }
    cVar3 = (anonymous_namespace)::LookupTables<signed_char>::kVminOverBase[(int)uVar8];
    if ((1 < (int)uVar8) && (-0x80 / (int)uVar8 != (int)cVar3)) {
      __assert_fail("base < 2 || std::numeric_limits<IntType>::min() / base == vmin_over_base",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O1/_deps/abseil-cpp-src/absl/strings/numbers.cc"
                    ,0x404,
                    "bool absl::(anonymous namespace)::safe_parse_negative_int(absl::string_view, int, IntType * _Nonnull) [IntType = signed char]"
                   );
    }
    if (0 < (long)this) {
      pnVar11 = this + (long)pnVar12;
      bVar9 = false;
      cVar6 = '\0';
      do {
        cVar4 = (anonymous_namespace)::kAsciiToInt[(byte)*pnVar12];
        if ((int)cVar4 < (int)uVar8) {
          if ((cVar6 < cVar3) || (cVar6 = cVar6 * cVar7, (int)cVar6 < cVar4 + -0x80)) {
            *pcVar10 = -0x80;
            goto LAB_001a444b;
          }
          cVar6 = cVar6 - cVar4;
          bVar5 = true;
        }
        else {
          *pcVar10 = cVar6;
LAB_001a444b:
          bVar5 = false;
        }
        if (!bVar5) {
          return bVar9;
        }
        pnVar12 = pnVar12 + 1;
        bVar9 = pnVar12 >= pnVar11;
      } while (pnVar12 < pnVar11);
      goto LAB_001a450b;
    }
  }
  bVar9 = (long)this < 1;
  cVar6 = '\0';
LAB_001a450b:
  *pcVar10 = cVar6;
  return bVar9;
}

Assistant:

bool safe_strto8_base(absl::string_view text, int8_t* absl_nonnull value,
                      int base) {
  return safe_int_internal<int8_t>(text, value, base);
}